

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.cpp
# Opt level: O3

void __thiscall indk::Neuron::Entry::~Entry(Entry *this)

{
  pointer ppSVar1;
  Synapse *pSVar2;
  pointer pfVar3;
  pointer ppSVar4;
  vector<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_> *__range1;
  
  ppSVar4 = (this->Synapses).
            super__Vector_base<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar1 = (this->Synapses).
            super__Vector_base<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppSVar4 != ppSVar1) {
    do {
      pSVar2 = *ppSVar4;
      if ((pSVar2 != (Synapse *)0x0) &&
         (pfVar3 = (pSVar2->GammaQ).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start, pfVar3 != (pointer)0x0)) {
        operator_delete(pfVar3,(long)(pSVar2->GammaQ).
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage - (long)pfVar3);
      }
      operator_delete(pSVar2,0x60);
      ppSVar4 = ppSVar4 + 1;
    } while (ppSVar4 != ppSVar1);
    ppSVar4 = (this->Synapses).
              super__Vector_base<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  if (ppSVar4 != (pointer)0x0) {
    operator_delete(ppSVar4,(long)(this->Synapses).
                                  super__Vector_base<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar4
                   );
    return;
  }
  return;
}

Assistant:

indk::Neuron::Entry::~Entry() {
    for (auto S: Synapses) delete S;
}